

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallSubdirectoryGenerator::GenerateScript(cmInstallSubdirectoryGenerator *this,ostream *os)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  cmScriptGeneratorIndent cVar3;
  ostream *poVar4;
  undefined1 local_78 [8];
  string odir;
  Indent indent;
  PolicyStatus status;
  allocator<char> local_39;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  cmInstallSubdirectoryGenerator *this_local;
  
  this_00 = this->Makefile;
  local_18 = os;
  os_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"EXCLUDE_FROM_ALL",&local_39);
  bVar1 = cmMakefile::GetPropertyAsBool(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if ((((((bVar1 ^ 0xffU) & 1) != 0) &&
       (PVar2 = cmLocalGenerator::GetPolicyStatus(this->LocalGenerator,CMP0082), PVar2 != OLD)) &&
      (PVar2 != WARN)) && (PVar2 - NEW < 3)) {
    cmScriptGeneratorIndent::cmScriptGeneratorIndent
              ((cmScriptGeneratorIndent *)((long)&odir.field_2 + 0xc));
    std::__cxx11::string::string((string *)local_78,(string *)&this->BinaryDirectory);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_78);
    poVar4 = ::operator<<(local_18,(cmScriptGeneratorIndent)odir.field_2._12_4_);
    poVar4 = std::operator<<(poVar4,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n");
    cVar3 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&odir.field_2 + 0xc),2);
    poVar4 = ::operator<<(poVar4,cVar3);
    poVar4 = std::operator<<(poVar4,"# Include the install script for the subdirectory.\n");
    cVar3 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&odir.field_2 + 0xc),2);
    poVar4 = ::operator<<(poVar4,cVar3);
    poVar4 = std::operator<<(poVar4,"include(\"");
    poVar4 = std::operator<<(poVar4,(string *)local_78);
    poVar4 = std::operator<<(poVar4,"/cmake_install.cmake\")\n");
    poVar4 = ::operator<<(poVar4,(cmScriptGeneratorIndent)odir.field_2._12_4_);
    std::operator<<(poVar4,"endif()\n\n");
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void cmInstallSubdirectoryGenerator::GenerateScript(std::ostream& os)
{
  if (!this->Makefile->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    cmPolicies::PolicyStatus status =
      this->LocalGenerator->GetPolicyStatus(cmPolicies::CMP0082);
    switch (status) {
      case cmPolicies::WARN:
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is handled in cmLocalGenerator::GenerateInstallRules()
        break;

      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS: {
        Indent indent;
        std::string odir = this->BinaryDirectory;
        cmSystemTools::ConvertToUnixSlashes(odir);
        os << indent << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n"
           << indent.Next()
           << "# Include the install script for the subdirectory.\n"
           << indent.Next() << "include(\"" << odir
           << "/cmake_install.cmake\")\n"
           << indent << "endif()\n\n";
      } break;
    }
  }
}